

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_location.cpp
# Opt level: O3

void __thiscall
Am_Inter_Location::Copy_From(Am_Inter_Location *this,Am_Inter_Location *other_data,bool make_unique)

{
  int iVar1;
  undefined4 extraout_var;
  Am_Inter_Location_Data *this_00;
  
  this_00 = this->data;
  if (this_00 == (Am_Inter_Location_Data *)0x0) {
    this_00 = (Am_Inter_Location_Data *)operator_new(0x40);
    Am_Inter_Location_Data::Am_Inter_Location_Data(this_00);
  }
  else {
    if (!make_unique) goto LAB_001b51db;
    iVar1 = (*(this_00->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type[5])
                      (this_00);
    this_00 = (Am_Inter_Location_Data *)CONCAT44(extraout_var,iVar1);
  }
  this->data = this_00;
LAB_001b51db:
  Get_Location(other_data,&this_00->as_line,&this_00->ref_obj,(int *)&this_00->data,
               &(this_00->data).rect.top,&(this_00->data).rect.width,&(this_00->data).rect.height);
  return;
}

Assistant:

void
Am_Inter_Location::Copy_From(Am_Inter_Location &other_data, bool make_unique)
{
  if (data) {
    if (make_unique)
      data = (Am_Inter_Location_Data *)data->Make_Unique();
  } else
    data = new Am_Inter_Location_Data();
  other_data.Get_Location(data->as_line, data->ref_obj, data->data.line.x1,
                          data->data.line.y1, data->data.line.x2,
                          data->data.line.y2);
}